

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_filter.cpp
# Opt level: O0

void __thiscall
ParticleFilter::prediction
          (ParticleFilter *this,double delta_t,double *std,double velocity,double yaw_rate)

{
  double dVar1;
  double dVar2;
  result_type rVar3;
  double dVar4;
  result_type_conflict2 rVar5;
  size_type sVar6;
  reference pvVar7;
  undefined1 local_27c8 [8];
  normal_distribution<double> ns_t;
  normal_distribution<double> ns_y;
  normal_distribution<double> ns_x;
  undefined1 local_2758 [8];
  mt19937 gen;
  random_device rd;
  double theta;
  double dist;
  int i;
  double yaw_rate_local;
  double velocity_local;
  double *std_local;
  double delta_t_local;
  ParticleFilter *this_local;
  
  dist._4_4_ = 0;
  while( true ) {
    sVar6 = ::std::vector<Particle,_std::allocator<Particle>_>::size(&this->particles);
    if (sVar6 <= (ulong)(long)dist._4_4_) break;
    pvVar7 = ::std::vector<Particle,_std::allocator<Particle>_>::operator[]
                       (&this->particles,(long)dist._4_4_);
    dVar1 = pvVar7->theta;
    ::std::random_device::random_device((random_device *)&gen._M_p);
    rVar5 = ::std::random_device::operator()((random_device *)&gen._M_p);
    ::std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::mersenne_twister_engine
              ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                *)local_2758,(ulong)rVar5);
    ::std::normal_distribution<double>::normal_distribution
              ((normal_distribution<double> *)&ns_y._M_saved_available,0.0,*std);
    ::std::normal_distribution<double>::normal_distribution
              ((normal_distribution<double> *)&ns_t._M_saved_available,0.0,std[1]);
    ::std::normal_distribution<double>::normal_distribution
              ((normal_distribution<double> *)local_27c8,0.0,std[2]);
    if (0.001 <= ABS(yaw_rate)) {
      dVar2 = sin(yaw_rate * delta_t + dVar1);
      dVar4 = sin(dVar1);
      rVar3 = ::std::normal_distribution<double>::operator()
                        ((normal_distribution<double> *)&ns_y._M_saved_available,
                         (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)local_2758);
      pvVar7 = ::std::vector<Particle,_std::allocator<Particle>_>::operator[]
                         (&this->particles,(long)dist._4_4_);
      pvVar7->x = pvVar7->x + (velocity * (dVar2 - dVar4)) / yaw_rate + rVar3;
      dVar2 = cos(dVar1);
      dVar1 = cos(yaw_rate * delta_t + dVar1);
      rVar3 = ::std::normal_distribution<double>::operator()
                        ((normal_distribution<double> *)&ns_t._M_saved_available,
                         (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)local_2758);
      pvVar7 = ::std::vector<Particle,_std::allocator<Particle>_>::operator[]
                         (&this->particles,(long)dist._4_4_);
      pvVar7->y = pvVar7->y + (velocity * (dVar2 - dVar1)) / yaw_rate + rVar3;
      rVar3 = ::std::normal_distribution<double>::operator()
                        ((normal_distribution<double> *)local_27c8,
                         (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)local_2758);
      pvVar7 = ::std::vector<Particle,_std::allocator<Particle>_>::operator[]
                         (&this->particles,(long)dist._4_4_);
      pvVar7->theta = yaw_rate * delta_t + rVar3 + pvVar7->theta;
    }
    else {
      dVar2 = cos(dVar1);
      rVar3 = ::std::normal_distribution<double>::operator()
                        ((normal_distribution<double> *)&ns_y._M_saved_available,
                         (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)local_2758);
      pvVar7 = ::std::vector<Particle,_std::allocator<Particle>_>::operator[]
                         (&this->particles,(long)dist._4_4_);
      pvVar7->x = pvVar7->x + velocity * delta_t * dVar2 + rVar3;
      dVar1 = sin(dVar1);
      rVar3 = ::std::normal_distribution<double>::operator()
                        ((normal_distribution<double> *)&ns_t._M_saved_available,
                         (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)local_2758);
      pvVar7 = ::std::vector<Particle,_std::allocator<Particle>_>::operator[]
                         (&this->particles,(long)dist._4_4_);
      pvVar7->y = velocity * delta_t * dVar1 + rVar3 + pvVar7->y;
    }
    ::std::random_device::~random_device((random_device *)&gen._M_p);
    dist._4_4_ = dist._4_4_ + 1;
  }
  return;
}

Assistant:

void ParticleFilter::prediction(double delta_t, double std[], double velocity, double yaw_rate) 
{
  for (int i=0; i<particles.size(); i++)
  {
    double dist = velocity * delta_t;
    double theta = particles[i].theta;

    std::random_device rd;
    std::mt19937 gen(rd());
    std::normal_distribution<> ns_x(0.0, std[0]);
    std::normal_distribution<> ns_y(0.0, std[1]);
    std::normal_distribution<> ns_t(0.0, std[2]);

    // Conditionally do the full prediction including yaw rate
    if (fabs(yaw_rate) < 0.001)
    {
      particles[i].x += dist * cos(theta) + ns_x(gen);
      particles[i].y += dist * sin(theta) + ns_y(gen);
    }
    else
    {
      particles[i].x += velocity * (sin(theta + yaw_rate * delta_t) - sin(theta)) / yaw_rate + ns_x(gen);
      particles[i].y += velocity * (cos(theta) - cos(theta + yaw_rate * delta_t)) / yaw_rate + ns_y(gen);
      particles[i].theta += yaw_rate * delta_t + ns_t(gen);
    }
  }
}